

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O3

void __thiscall
vkt::Context::Context
          (Context *this,TestContext *testCtx,PlatformInterface *platformInterface,
          ProgramCollection<vk::ProgramBinary> *progCollection)

{
  DefaultDevice *this_00;
  Allocator *pAVar1;
  
  this->m_testCtx = testCtx;
  this->m_platformInterface = platformInterface;
  this->m_progCollection = progCollection;
  this_00 = (DefaultDevice *)operator_new(0xac0);
  DefaultDevice::DefaultDevice(this_00,platformInterface,testCtx->m_cmdLine);
  (this->m_device).super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
  m_data.ptr = this_00;
  pAVar1 = createAllocator(this_00);
  (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr
       = pAVar1;
  return;
}

Assistant:

Context::Context (tcu::TestContext&							testCtx,
				  const vk::PlatformInterface&				platformInterface,
				  vk::ProgramCollection<vk::ProgramBinary>&	progCollection)
	: m_testCtx				(testCtx)
	, m_platformInterface	(platformInterface)
	, m_progCollection		(progCollection)
	, m_device				(new DefaultDevice(m_platformInterface, testCtx.getCommandLine()))
	, m_allocator			(createAllocator(m_device.get()))
{
}